

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O1

QDistanceFieldData * QDistanceFieldData::create(QSize size,QPainterPath *path,bool doubleResolution)

{
  QPoint *pQVar1;
  int *piVar2;
  char cVar3;
  ushort uVar4;
  ushort uVar5;
  uint width;
  int iVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  Representation RVar9;
  qsizetype qVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  qint32 *bits;
  ulong uVar16;
  QVarLengthArray<unsigned_short,_16LL> *pQVar17;
  QPoint *pQVar18;
  Representation *pRVar19;
  uint *puVar20;
  qint32 *pqVar21;
  uchar *puVar22;
  int y;
  int iVar23;
  Representation RVar24;
  long lVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  undefined7 in_register_00000011;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  int y_5;
  int iVar32;
  uint uVar33;
  uint uVar34;
  long lVar35;
  uint uVar36;
  int iVar37;
  uint uVar38;
  qreal *pqVar39;
  QTransform *pQVar40;
  int y_4;
  int iVar41;
  int iVar42;
  QPoint *pQVar43;
  int y_7;
  int iVar44;
  ulong uVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  uint uVar49;
  int iVar50;
  int iVar51;
  int y_1;
  int iVar52;
  int iVar53;
  int iVar54;
  uint uVar55;
  long lVar56;
  long lVar57;
  ulong uVar58;
  long in_FS_OFFSET;
  byte bVar59;
  undefined1 auVar60 [16];
  double dVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  int *oldD;
  QPoint p;
  QPoint n;
  QVarLengthArray<bool,_256LL> needsClipping;
  QVarLengthArray<bool,_256LL> isConvex;
  QVarLengthArray<QPoint,_256LL> vertices;
  QVarLengthArray<QPoint,_256LL> normals;
  QTransform transform;
  QVarLengthArray<QVarLengthArray<unsigned_short,_16LL>,_128LL> scans;
  qint32 in_stack_ffffffffffffcf68;
  int local_3090;
  int local_308c;
  int local_3084;
  int local_3070;
  Representation local_302c;
  Representation *local_3028;
  QPoint *local_3020;
  QPoint *local_3018;
  QPoint *local_3010;
  QPoint *local_3008;
  Representation local_3000;
  undefined1 local_2ffc [8];
  undefined4 uStack_2ff4;
  undefined8 local_2ff0;
  QPoint *local_2fe8;
  undefined1 local_2fdc [12];
  long local_2fd0;
  Representation *local_2fc8;
  QPoint *local_2fc0;
  int local_2fb4;
  QDistanceFieldData *local_2fb0;
  qint32 *local_2fa8;
  int local_2f9c;
  Representation *local_2f98;
  uint *local_2f90;
  long local_2f88;
  Representation *local_2f80;
  uint local_2f74;
  int local_2f70;
  int local_2f6c;
  Representation *local_2f68;
  double local_2f60;
  long local_2f58;
  QSize local_2f50;
  QPoint local_2f48;
  QPoint local_2f40;
  QDataBuffer<QPoint> local_2f38;
  QDataBuffer<unsigned_int> local_2f18;
  QVLABase<bool> local_2f00;
  undefined1 local_2ee8 [256];
  QVLABase<bool> local_2de8;
  undefined1 local_2dd0 [256];
  QVLABase<QPoint> local_2cd0;
  undefined1 local_2cb8 [2048];
  QVLABase<QPoint> local_24b8;
  undefined1 local_24a0 [2048];
  QTransform local_1ca0;
  QPoint local_1c50;
  long local_1c48;
  QVarLengthArray<unsigned_short,_16LL> *local_1c40;
  QVarLengthArray<unsigned_short,_16LL> local_1c38 [128];
  long local_38;
  
  bVar59 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_2f50 = size;
  local_2fb0 = create(&local_2f50);
  initialDistanceFieldFactor();
  iVar23 = QT_DISTANCEFIELD_DEFAULT_SCALE;
  if ((int)CONCAT71(in_register_00000011,doubleResolution) != 0) {
    iVar23 = QT_DISTANCEFIELD_DEFAULT_SCALE / 2;
  }
  initialDistanceFieldFactor();
  iVar50 = QT_DISTANCEFIELD_DEFAULT_RADIUS;
  if (doubleResolution) {
    iVar50 = QT_DISTANCEFIELD_DEFAULT_RADIUS / 2;
  }
  initialDistanceFieldFactor();
  iVar53 = QT_DISTANCEFIELD_DEFAULT_SCALE;
  if (doubleResolution) {
    iVar53 = QT_DISTANCEFIELD_DEFAULT_SCALE / 2;
  }
  iVar50 = iVar50 / iVar53;
  puVar22 = local_2fb0->data;
  if (puVar22 != (uchar *)0x0) {
    bVar11 = QPainterPath::isEmpty(path);
    if (bVar11) {
      memset(puVar22,0,(long)local_2fb0->nbytes);
    }
    else {
      width = local_2fb0->width;
      iVar53 = local_2fb0->height;
      lVar35 = (long)iVar53;
      pqVar39 = (qreal *)&DAT_006b6068;
      pQVar40 = &local_1ca0;
      for (lVar25 = 10; lVar25 != 0; lVar25 = lVar25 + -1) {
        pQVar40->m_matrix[0][0] = *pqVar39;
        pqVar39 = pqVar39 + (ulong)bVar59 * -2 + 1;
        pQVar40 = (QTransform *)((long)pQVar40 + ((ulong)bVar59 * -2 + 1) * 8);
      }
      pqVar39 = (qreal *)&DAT_006b6020;
      pQVar40 = &local_1ca0;
      for (lVar25 = 9; lVar25 != 0; lVar25 = lVar25 + -1) {
        pQVar40->m_matrix[0][0] = *pqVar39;
        pqVar39 = pqVar39 + (ulong)bVar59 * -2 + 1;
        pQVar40 = (QTransform *)((long)pQVar40 + ((ulong)bVar59 * -2 + 1) * 8);
      }
      local_1ca0._72_2_ = local_1ca0._72_2_ & 0xfc00;
      QTransform::translate(&local_1ca0,(double)iVar50,(double)iVar50);
      QTransform::scale(&local_1ca0,1.0 / (double)iVar23,1.0 / (double)iVar23);
      local_2f18.capacity = 0;
      local_2f18.siz = 0;
      local_2f18.buffer = (uint *)0x0;
      local_2f38.capacity = 0;
      local_2f38.siz = 0;
      local_2f38.buffer = (QPoint *)0x0;
      qSimplifyPath(path,&local_2f38,&local_2f18,&local_1ca0);
      if (local_2f38.siz == 0) {
        lcDistanceField();
        if (((byte)lcDistanceField::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1)
            != 0) {
          create();
        }
        memset(local_2fb0->data,0,(long)local_2fb0->nbytes);
      }
      else {
        uVar29 = iVar53 * width;
        uVar16 = 0xffffffffffffffff;
        if (-1 < (int)uVar29) {
          uVar16 = (long)(int)uVar29 * 4;
        }
        bits = (qint32 *)operator_new__(uVar16);
        auVar8 = _DAT_00684850;
        if (0 < (int)uVar29) {
          lVar25 = (ulong)uVar29 - 1;
          auVar60._8_4_ = (int)lVar25;
          auVar60._0_8_ = lVar25;
          auVar60._12_4_ = (int)((ulong)lVar25 >> 0x20);
          uVar16 = 0;
          auVar60 = auVar60 ^ _DAT_00684850;
          auVar62 = _DAT_00684830;
          auVar63 = _DAT_00684840;
          do {
            auVar67 = auVar63 ^ auVar8;
            iVar23 = auVar60._4_4_;
            if ((bool)(~(auVar67._4_4_ == iVar23 && auVar60._0_4_ < auVar67._0_4_ ||
                        iVar23 < auVar67._4_4_) & 1)) {
              bits[uVar16] = 0x7f80;
            }
            if ((auVar67._12_4_ != auVar60._12_4_ || auVar67._8_4_ <= auVar60._8_4_) &&
                auVar67._12_4_ <= auVar60._12_4_) {
              bits[uVar16 + 1] = 0x7f80;
            }
            auVar67 = auVar62 ^ auVar8;
            iVar52 = auVar67._4_4_;
            if (iVar52 <= iVar23 && (iVar52 != iVar23 || auVar67._0_4_ <= auVar60._0_4_)) {
              bits[uVar16 + 2] = 0x7f80;
              bits[uVar16 + 3] = 0x7f80;
            }
            uVar16 = uVar16 + 4;
            lVar25 = auVar63._8_8_;
            auVar63._0_8_ = auVar63._0_8_ + 4;
            auVar63._8_8_ = lVar25 + 4;
            lVar25 = auVar62._8_8_;
            auVar62._0_8_ = auVar62._0_8_ + 4;
            auVar62._8_8_ = lVar25 + 4;
          } while ((uVar29 + 3 & 0xfffffffc) != uVar16);
        }
        local_2f90 = local_2f18.buffer;
        memset(&local_24b8,0xaa,0x818);
        local_24b8.super_QVLABaseBase.a = 0x100;
        local_24b8.super_QVLABaseBase.s = 0;
        local_24b8.super_QVLABaseBase.ptr = local_24a0;
        memset(&local_2cd0,0xaa,0x818);
        local_2cd0.super_QVLABaseBase.a = 0x100;
        local_2cd0.super_QVLABaseBase.s = 0;
        local_2cd0.super_QVLABaseBase.ptr = local_2cb8;
        memset(&local_2de8,0xaa,0x118);
        local_2de8.super_QVLABaseBase.a = 0x100;
        local_2de8.super_QVLABaseBase.s = 0;
        local_2de8.super_QVLABaseBase.ptr = local_2dd0;
        memset(&local_2f00,0xaa,0x118);
        local_2f00.super_QVLABaseBase.a = 0x100;
        local_2f00.super_QVLABaseBase.s = 0;
        local_2f00.super_QVLABaseBase.ptr = local_2ee8;
        local_2fc0 = local_2f38.buffer;
        iVar23 = (int)local_2f18.siz;
        memset(&local_1c50,0xaa,0x1c18);
        local_1c50.xp.m_i = 0x80;
        local_1c50.yp.m_i = 0;
        local_1c48 = 0;
        local_1c40 = local_1c38;
        if (0x80 < iVar53) {
          create();
        }
        if (0 < iVar53) {
          lVar25 = lVar35 + 1;
          pQVar17 = local_1c40;
          do {
            (pQVar17->super_QVLABase<unsigned_short>).super_QVLABaseBase.a = 0x10;
            (pQVar17->super_QVLABase<unsigned_short>).super_QVLABaseBase.s = 0;
            (pQVar17->super_QVLABase<unsigned_short>).super_QVLABaseBase.ptr =
                 &pQVar17->super_QVLAStorage<2UL,_2UL,_16LL>;
            lVar25 = lVar25 + -1;
            pQVar17 = pQVar17 + 1;
          } while (1 < lVar25);
        }
        local_2f88 = lVar35;
        local_1c48 = lVar35;
        if (1 < iVar23) {
          iVar53 = 1;
          local_3090 = 0;
          do {
            uVar29 = local_2f90[iVar53];
            iVar52 = iVar53;
            if (uVar29 == 0xffffffff) {
              uVar29 = local_2f90[local_3090];
              iVar52 = iVar53 + 1;
              local_3090 = iVar52;
            }
            pQVar1 = local_2fc0 + local_2f90[(long)iVar53 + -1];
            pQVar43 = local_2fc0 + uVar29;
            pQVar18 = pQVar1;
            if ((pQVar43->yp).m_i < (pQVar1->yp).m_i) {
              pQVar18 = pQVar43;
              pQVar43 = pQVar1;
            }
            iVar53 = (pQVar18->yp).m_i;
            uVar16 = (ulong)(uint)(iVar53 >> 8);
            if (iVar53 >> 8 < 1) {
              uVar16 = 0;
            }
            iVar41 = (pQVar43->yp).m_i;
            uVar29 = iVar41 >> 8;
            if ((int)(uint)local_2f88 <= (int)uVar29) {
              uVar29 = (uint)local_2f88;
            }
            if ((int)uVar16 < (int)uVar29) {
              iVar30 = (pQVar18->xp).m_i;
              iVar44 = (pQVar43->xp).m_i - iVar30;
              iVar41 = iVar41 - iVar53;
              iVar30 = ((((int)uVar16 * 0x100 - iVar53) + 0xff) * iVar44) / iVar41 + iVar30;
              lVar35 = uVar16 * 0x38;
              lVar25 = uVar29 - uVar16;
              do {
                if ((uint)(iVar30 >> 8) < width) {
                  local_2f40.xp.m_i._0_2_ = (short)((uint)iVar30 >> 8);
                  QVLABase<unsigned_short>::emplace_back_impl<unsigned_short>
                            ((QVLABase<unsigned_short> *)
                             ((local_1c40->super_QVLAStorage<2UL,_2UL,_16LL>).array + lVar35 + -0x18
                             ),0x10,(local_1c40->super_QVLAStorage<2UL,_2UL,_16LL>).array + lVar35,
                             (unsigned_short *)&local_2f40);
                }
                iVar30 = iVar30 + (iVar44 * 0x100) / iVar41;
                lVar35 = lVar35 + 0x38;
                lVar25 = lVar25 + -1;
              } while (lVar25 != 0);
            }
            iVar53 = iVar52 + 1;
          } while (iVar53 < iVar23);
        }
        lVar25 = local_2f88;
        auVar63 = _DAT_00684850;
        auVar62 = _DAT_00684840;
        auVar8 = _DAT_00684830;
        local_2fd0 = (long)(int)width;
        iVar23 = (int)local_2f88;
        if (0 < iVar23) {
          pqVar21 = bits + 2;
          lVar35 = 0;
          do {
            pvVar7 = local_1c40[lVar35].super_QVLABase<unsigned_short>.super_QVLABaseBase.ptr;
            uVar29 = (uint)local_1c40[lVar35].super_QVLABase<unsigned_short>.super_QVLABaseBase.s;
            if (1 < (int)uVar29) {
              uVar16 = 1;
              do {
                uVar4 = *(ushort *)((long)pvVar7 + uVar16 * 2);
                uVar31 = uVar16;
                do {
                  uVar5 = *(ushort *)((long)pvVar7 + uVar31 * 2 + -2);
                  if (uVar5 <= uVar4) goto LAB_00483317;
                  *(ushort *)((long)pvVar7 + uVar31 * 2) = uVar5;
                  uVar31 = uVar31 - 1;
                } while (uVar31 != 0);
                uVar31 = 0;
LAB_00483317:
                *(ushort *)((long)pvVar7 + (long)(int)uVar31 * 2) = uVar4;
                uVar16 = uVar16 + 1;
              } while (uVar16 != (uVar29 & 0x7fffffff));
            }
            uVar16 = 0;
            if (1 < (int)uVar29) {
              uVar31 = 0;
              do {
                uVar4 = *(ushort *)((long)pvVar7 + uVar31 * 2);
                uVar16 = (ulong)uVar4;
                uVar5 = *(ushort *)((long)pvVar7 + uVar31 * 2 + 2);
                if (uVar4 < uVar5) {
                  lVar56 = uVar5 - uVar16;
                  lVar57 = lVar56 + -1;
                  auVar67._8_4_ = (int)lVar57;
                  auVar67._0_8_ = lVar57;
                  auVar67._12_4_ = (int)((ulong)lVar57 >> 0x20);
                  uVar58 = 0;
                  do {
                    auVar65._8_4_ = (int)uVar58;
                    auVar65._0_8_ = uVar58;
                    auVar65._12_4_ = (int)(uVar58 >> 0x20);
                    auVar60 = (auVar65 | auVar62) ^ auVar63;
                    iVar53 = SUB164(auVar67 ^ auVar63,0);
                    bVar11 = iVar53 < auVar60._0_4_;
                    iVar52 = SUB164(auVar67 ^ auVar63,4);
                    iVar41 = auVar60._4_4_;
                    if ((bool)(~(iVar52 < iVar41 || iVar41 == iVar52 && bVar11) & 1)) {
                      pqVar21[uVar16 + (uVar58 - 2)] = -0x7f80;
                    }
                    if (iVar52 >= iVar41 && (iVar41 != iVar52 || !bVar11)) {
                      pqVar21[uVar16 + (uVar58 - 1)] = -0x7f80;
                    }
                    auVar60 = (auVar65 | auVar8) ^ auVar63;
                    iVar41 = auVar60._4_4_;
                    if (iVar41 <= iVar52 && (iVar41 != iVar52 || auVar60._0_4_ <= iVar53)) {
                      pqVar21[uVar16 + uVar58] = -0x7f80;
                      pqVar21[uVar16 + uVar58 + 1] = -0x7f80;
                    }
                    uVar58 = uVar58 + 4;
                  } while ((lVar56 + 3U & 0xfffffffffffffffc) != uVar58);
                }
                uVar16 = uVar31 + 2;
                uVar58 = uVar31 + 3;
                uVar31 = uVar16;
              } while (uVar58 < (uVar29 & 0x7fffffff));
            }
            if (((int)uVar16 < (int)uVar29) &&
               (uVar4 = *(ushort *)((long)pvVar7 + (uVar16 & 0xffffffff) * 2), uVar16 = (ulong)uVar4
               , (int)(uint)uVar4 < (int)width)) {
              lVar56 = width - uVar16;
              lVar57 = lVar56 + -1;
              auVar64._8_4_ = (int)lVar57;
              auVar64._0_8_ = lVar57;
              auVar64._12_4_ = (int)((ulong)lVar57 >> 0x20);
              uVar31 = 0;
              do {
                auVar66._8_4_ = (int)uVar31;
                auVar66._0_8_ = uVar31;
                auVar66._12_4_ = (int)(uVar31 >> 0x20);
                auVar60 = (auVar66 | auVar62) ^ auVar63;
                iVar53 = SUB164(auVar64 ^ auVar63,0);
                bVar11 = iVar53 < auVar60._0_4_;
                iVar52 = SUB164(auVar64 ^ auVar63,4);
                iVar41 = auVar60._4_4_;
                if ((bool)(~(iVar52 < iVar41 || iVar41 == iVar52 && bVar11) & 1)) {
                  pqVar21[uVar16 + (uVar31 - 2)] = -0x7f80;
                }
                if (iVar52 >= iVar41 && (iVar41 != iVar52 || !bVar11)) {
                  pqVar21[uVar16 + (uVar31 - 1)] = -0x7f80;
                }
                auVar60 = (auVar66 | auVar8) ^ auVar63;
                iVar41 = auVar60._4_4_;
                if (iVar41 <= iVar52 && (iVar41 != iVar52 || auVar60._0_4_ <= iVar53)) {
                  pqVar21[uVar16 + uVar31] = -0x7f80;
                  pqVar21[uVar16 + uVar31 + 1] = -0x7f80;
                }
                uVar31 = uVar31 + 4;
              } while ((lVar56 + 3U & 0xfffffffffffffffc) != uVar31);
            }
            lVar35 = lVar35 + 1;
            pqVar21 = pqVar21 + local_2fd0;
          } while (lVar35 != local_2f88);
        }
        std::_Destroy_n_aux<false>::__destroy_n<QVarLengthArray<unsigned_short,16ll>*,long_long>
                  (local_1c40,local_1c48);
        if (local_1c40 != local_1c38) {
          QtPrivate::sizedFree(local_1c40,(long)local_1c50 * 0x38);
        }
        lVar35 = local_2fd0;
        if (0 < local_2f18.siz) {
          local_2f60 = (double)(iVar50 << 0x10);
          local_2f9c = iVar50 << 8;
          local_2f6c = (width - iVar50) * 0x100;
          local_2f70 = (iVar23 - iVar50) * 0x100;
          local_2fa8 = bits + -1;
          iVar23 = 0;
          do {
            local_24b8.super_QVLABaseBase.s = 0;
            local_2cd0.super_QVLABaseBase.s = 0;
            local_2f00.super_QVLABaseBase.s = 0;
            lVar25 = (long)iVar23 + -2;
            local_2f74 = -iVar23;
            iVar50 = 0;
            do {
              iVar53 = iVar50;
              local_2f74 = local_2f74 - 1;
              lVar56 = lVar25 + 2;
              lVar25 = lVar25 + 1;
              iVar50 = iVar53 + 1;
            } while (local_2f90[lVar56] != 0xffffffff);
            lVar56 = (long)iVar23;
            puVar20 = local_2f90;
            if (iVar23 < (int)~local_2f74) {
              do {
                lVar57 = lVar56;
                pQVar1 = local_2f38.buffer;
                uVar29 = puVar20[lVar57];
                iVar23 = local_2f38.buffer[uVar29].xp.m_i;
                iVar50 = local_2f38.buffer[puVar20[(int)lVar25]].xp.m_i;
                local_2f40.yp.m_i = iVar50 - iVar23;
                local_2f40.xp.m_i =
                     local_2f38.buffer[uVar29].yp.m_i -
                     local_2f38.buffer[puVar20[(int)lVar25]].yp.m_i;
                if ((local_2f40.xp.m_i != 0) || (iVar50 != iVar23)) {
                  dVar61 = (double)local_2f40.yp.m_i;
                  dVar61 = (double)local_2f40.xp.m_i * (double)local_2f40.xp.m_i + dVar61 * dVar61;
                  if (dVar61 < 0.0) {
                    dVar61 = sqrt(dVar61);
                  }
                  else {
                    dVar61 = SQRT(dVar61);
                  }
                  iVar23 = (int)((double)((ulong)(local_2f60 / dVar61) & 0x8000000000000000 |
                                         (ulong)DAT_00684780) + local_2f60 / dVar61);
                  local_2f40.yp.m_i = iVar23 * local_2f40.yp.m_i >> 8;
                  local_2f40.xp.m_i = local_2f40.xp.m_i * iVar23 >> 8;
                  if (local_24b8.super_QVLABaseBase.s == local_24b8.super_QVLABaseBase.a) {
                    local_1c50 = local_2f40;
                    QVLABase<QPoint>::emplace_back_impl<QPoint>
                              (&local_24b8,0x100,local_24a0,&local_1c50);
                  }
                  else {
                    QVLABase<QPoint>::emplace_back_impl<QPoint_const&>
                              (&local_24b8,0x100,local_24a0,&local_2f40);
                  }
                  local_2f48.xp.m_i = pQVar1[uVar29].xp.m_i + 0x7f;
                  local_2f48.yp.m_i = pQVar1[uVar29].yp.m_i + 0x7f;
                  if (local_2cd0.super_QVLABaseBase.s == local_2cd0.super_QVLABaseBase.a) {
                    local_1c50 = local_2f48;
                    QVLABase<QPoint>::emplace_back_impl<QPoint>
                              (&local_2cd0,0x100,local_2cb8,&local_1c50);
                  }
                  else {
                    QVLABase<QPoint>::emplace_back_impl<QPoint_const&>
                              (&local_2cd0,0x100,local_2cb8,&local_2f48);
                  }
                  iVar23 = pQVar1[uVar29].xp.m_i;
                  bVar11 = true;
                  if (((local_2f9c <= iVar23) && (iVar23 < local_2f6c)) &&
                     (iVar23 = pQVar1[uVar29].yp.m_i, local_2f9c <= iVar23)) {
                    bVar11 = local_2f70 <= iVar23;
                  }
                  local_1c50.xp.m_i._0_1_ = bVar11;
                  QVLABase<bool>::emplace_back_impl<bool>
                            (&local_2f00,0x100,local_2ee8,(bool *)&local_1c50);
                  puVar20 = local_2f90;
                }
                iVar53 = iVar53 + -1;
                lVar56 = lVar57 + 1;
                lVar25 = lVar57;
              } while (iVar53 != 0);
            }
            qVar10 = local_24b8.super_QVLABaseBase.s;
            uVar16 = local_2de8.super_QVLABaseBase.a;
            if (local_2de8.super_QVLABaseBase.a <= local_24b8.super_QVLABaseBase.s) {
              uVar16 = local_24b8.super_QVLABaseBase.s;
            }
            QVLABase<bool>::reallocate_impl
                      (&local_2de8,0x100,local_2dd0,local_24b8.super_QVLABaseBase.s,uVar16);
            local_2de8.super_QVLABaseBase.s = qVar10;
            lVar25 = local_2f88;
            if (0 < local_24b8.super_QVLABaseBase.s) {
              iVar50 = (int)local_24b8.super_QVLABaseBase.s + -1;
              uVar16 = 0;
              iVar23 = iVar50;
              do {
                lVar56 = (long)iVar23;
                *(bool *)((long)local_2de8.super_QVLABaseBase.ptr + lVar56) =
                     *(int *)((long)local_24b8.super_QVLABaseBase.ptr + uVar16 * 8 + 4) *
                     *(int *)((long)local_24b8.super_QVLABaseBase.ptr + lVar56 * 8) <
                     *(int *)((long)local_24b8.super_QVLABaseBase.ptr + uVar16 * 8) *
                     *(int *)((long)local_24b8.super_QVLABaseBase.ptr + lVar56 * 8 + 4);
                iVar23 = (int)uVar16;
                uVar16 = uVar16 + 1;
              } while (local_24b8.super_QVLABaseBase.s != uVar16);
              if (0 < local_24b8.super_QVLABaseBase.s) {
                lVar57 = 0;
                lVar56 = local_2f88;
                do {
                  lVar25 = local_2f88;
                  uVar16 = *(ulong *)((long)local_24b8.super_QVLABaseBase.ptr + lVar57 * 8);
                  uVar31 = uVar16 >> 0x20;
                  local_2fc0 = (QPoint *)(long)iVar50;
                  pQVar1 = (QPoint *)
                           ((long)local_2cd0.super_QVLABaseBase.ptr + (long)local_2fc0 * 8);
                  pQVar43 = (QPoint *)((long)local_2cd0.super_QVLABaseBase.ptr + lVar57 * 8);
                  iVar23 = (pQVar43->xp).m_i;
                  iVar50 = (pQVar43->yp).m_i;
                  RVar24 = (*pQVar1).xp;
                  iVar52 = (int)uVar16;
                  local_2f40.yp = (*pQVar1).yp;
                  RVar9.m_i = local_2f40.yp.m_i;
                  iVar53 = (int)(uVar16 >> 0x20);
                  local_2f40.yp.m_i = local_2f40.yp.m_i - iVar53;
                  local_2f40.xp.m_i = RVar24.m_i - iVar52;
                  local_1c50.yp.m_i = RVar9.m_i + iVar53;
                  local_1c50.xp.m_i = RVar24.m_i + iVar52;
                  local_2ffc._0_4_ = iVar23 - iVar52;
                  local_3000.m_i = iVar50 - iVar53;
                  local_2fdc._0_4_ = iVar23 + iVar52;
                  local_302c.m_i = iVar50 + iVar53;
                  cVar3 = *(char *)((long)local_2f00.super_QVLABaseBase.ptr + (long)local_2fc0);
                  local_2f58 = lVar57;
                  if ((cVar3 == '\0') &&
                     (*(char *)((long)local_2f00.super_QVLABaseBase.ptr + lVar57) != '\x01')) {
                    local_3070 = 0x7f80;
                    if (iVar50 < (pQVar1->yp).m_i) {
                      local_3070 = -0x7f80;
                      local_2f98 = &local_3000;
                      local_2fe8 = (QPoint *)local_2ffc;
                      local_3028 = &local_302c;
                      local_3018 = (QPoint *)local_2fdc;
                      local_2f68 = &local_2f40.yp;
                      local_2f80 = &local_1c50.yp;
                      local_3008 = &local_1c50;
                      pQVar18 = pQVar43;
                      pQVar43 = pQVar1;
                    }
                    else {
                      local_2f98 = &local_1c50.yp;
                      local_2fe8 = &local_1c50;
                      local_3028 = &local_2f40.yp;
                      local_3018 = &local_2f40;
                      local_2f68 = &local_302c;
                      local_2f80 = &local_3000;
                      local_3008 = (QPoint *)local_2ffc;
                      pQVar18 = pQVar1;
                    }
                    uVar29 = (pQVar18->yp).m_i;
                    local_3010 = pQVar43;
                    uVar36 = (pQVar43->yp).m_i;
                    uVar33 = local_2f98->m_i;
                    iVar23 = local_2f68->m_i;
                    local_2fdc._4_4_ = iVar23;
                    uVar34 = local_3028->m_i;
                    iVar50 = local_2f80->m_i;
                    local_308c = 0;
                    local_3084 = 0;
                    local_3090 = 0;
                    iVar53 = uVar34 - uVar33;
                    if (iVar53 != 0) {
                      local_3090 = (((local_3018->xp).m_i - (local_2fe8->xp).m_i) * 0x100) / iVar53;
                      local_3084 = (local_3070 << 9) / iVar53;
                    }
                    iVar52 = uVar34 - iVar50;
                    if (iVar52 != 0) {
                      local_308c = (((local_3018->xp).m_i - (local_3008->xp).m_i) * 0x100) / iVar52;
                    }
                    iVar41 = (local_3018->xp).m_i;
                    local_2fb4 = (local_2fe8->xp).m_i;
                    iVar48 = iVar41 - local_2fb4;
                    local_2fc8 = (Representation *)CONCAT44(local_2fc8._4_4_,iVar48);
                    iVar30 = (local_3008->xp).m_i;
                    iVar44 = (local_2fb4 - iVar30) * iVar53 + (iVar50 - uVar33) * iVar48;
                    if (iVar44 == 0) {
                      iVar44 = 0;
                    }
                    else {
                      iVar44 = (int)(((long)(int)((iVar50 - uVar34) * local_3070) << 9) /
                                    (long)iVar44);
                    }
                    iVar14 = (int)uVar29 >> 8;
                    uVar28 = ~uVar36;
                    iVar37 = (int)uVar36 >> 8;
                    iVar15 = (int)uVar33 >> 8;
                    iVar54 = iVar23 >> 8;
                    iVar13 = (int)uVar34 >> 8;
                    local_3020 = (QPoint *)CONCAT44(local_3020._4_4_,iVar13);
                    iVar42 = iVar50 >> 8;
                    uVar29 = ~uVar29 & 0xff;
                    local_2ff0 = (QPoint *)(CONCAT44(local_2ff0._4_4_,~uVar33) & 0xffffffff000000ff)
                    ;
                    stack0xffffffffffffd008 =
                         (Representation *)(CONCAT44(uStack_2ff4,~uVar34) & 0xffffffff000000ff);
                    iVar12 = (pQVar43->xp).m_i;
                    iVar6 = (pQVar18->xp).m_i;
                    if (iVar12 < iVar6) {
                      if ((int)uVar33 < iVar50) {
                        uVar36 = (local_2ffc._4_4_ * (iVar41 - iVar30)) / iVar52 + iVar41;
                        if (iVar13 != iVar15) {
                          iVar50 = iVar6 + (iVar13 - iVar14) * local_3090 +
                                   (int)(iVar48 * uVar29) / iVar53;
                          iVar23 = iVar15 - iVar13;
                          pqVar21 = bits + (int)(iVar13 * width);
                          do {
                            if ((int)uVar36 >> 8 < iVar50 >> 8) {
                              uVar29 = ((int)((~uVar36 & 0xff) * iVar44) >> 8) + local_3070;
                              lVar56 = (long)((int)uVar36 >> 8);
                              do {
                                uVar33 = -uVar29;
                                if (0 < (int)uVar29) {
                                  uVar33 = uVar29;
                                }
                                uVar34 = pqVar21[lVar56];
                                uVar38 = -uVar34;
                                if (0 < (int)uVar34) {
                                  uVar38 = uVar34;
                                }
                                if (uVar33 < uVar38) {
                                  uVar34 = uVar29;
                                }
                                pqVar21[lVar56] = uVar34;
                                uVar29 = uVar29 + iVar44;
                                lVar56 = lVar56 + 1;
                              } while (iVar50 >> 8 != (int)lVar56);
                            }
                            uVar36 = uVar36 + local_308c;
                            iVar50 = iVar50 + local_3090;
                            pqVar21 = pqVar21 + lVar35;
                            iVar23 = iVar23 + -1;
                          } while (iVar23 != 0);
                        }
                        uVar29 = ((iVar41 - iVar30) * (int)local_2ff0) / iVar52 + local_2fb4;
                        if (iVar15 != iVar42) {
                          pqVar21 = bits + (int)(iVar15 * width);
                          iVar23 = iVar42 - iVar15;
                          uVar33 = uVar29;
                          do {
                            if ((int)uVar36 >> 8 < (int)uVar33 >> 8) {
                              uVar34 = ((int)((~uVar36 & 0xff) * iVar44) >> 8) + local_3070;
                              lVar56 = (long)((int)uVar36 >> 8);
                              do {
                                uVar38 = -uVar34;
                                if (0 < (int)uVar34) {
                                  uVar38 = uVar34;
                                }
                                uVar55 = pqVar21[lVar56];
                                uVar49 = -uVar55;
                                if (0 < (int)uVar55) {
                                  uVar49 = uVar55;
                                }
                                if (uVar38 < uVar49) {
                                  uVar55 = uVar34;
                                }
                                pqVar21[lVar56] = uVar55;
                                uVar34 = uVar34 + iVar44;
                                lVar56 = lVar56 + 1;
                              } while ((int)uVar33 >> 8 != (int)lVar56);
                            }
                            uVar36 = uVar36 + local_308c;
                            uVar33 = uVar33 + local_308c;
                            pqVar21 = pqVar21 + lVar35;
                            iVar23 = iVar23 + -1;
                          } while (iVar23 != 0);
                          uVar29 = uVar29 + (iVar42 - iVar15) * local_308c;
                        }
                        if (iVar42 != iVar54) {
                          iVar23 = (iVar42 - iVar37) * local_3090 + (pQVar43->xp).m_i +
                                   (int)(((local_3018->xp).m_i - (local_2fe8->xp).m_i) *
                                        (uVar28 & 0xff)) / (local_3028->m_i - local_2f98->m_i);
                          iVar54 = iVar54 - iVar42;
                          pqVar21 = bits + (int)(iVar42 * width);
                          do {
                            if (iVar23 >> 8 < (int)uVar29 >> 8) {
                              uVar36 = ((int)((~uVar29 & 0xff) * iVar44) >> 8) -
                                       (local_3070 + iVar44);
                              lVar56 = (long)((int)uVar29 >> 8);
                              do {
                                uVar33 = -uVar36;
                                if (0 < (int)uVar36) {
                                  uVar33 = uVar36;
                                }
                                uVar34 = pqVar21[lVar56 + -1];
                                uVar28 = -uVar34;
                                if (0 < (int)uVar34) {
                                  uVar28 = uVar34;
                                }
                                if (uVar33 < uVar28) {
                                  uVar34 = uVar36;
                                }
                                pqVar21[lVar56 + -1] = uVar34;
                                lVar56 = lVar56 + -1;
                                uVar36 = uVar36 - iVar44;
                              } while (iVar23 >> 8 != (int)lVar56);
                            }
                            iVar23 = iVar23 + local_3090;
                            uVar29 = uVar29 + local_308c;
                            pqVar21 = pqVar21 + lVar35;
                            iVar54 = iVar54 + -1;
                          } while (iVar54 != 0);
                        }
                      }
                      else {
                        iVar23 = iVar6 + (iVar13 - iVar14) * local_3090 +
                                 (int)(uVar29 * iVar48) / iVar53;
                        iVar50 = iVar42 - iVar13;
                        if (iVar50 != 0) {
                          uVar29 = ((iVar41 - iVar30) * local_2ffc._4_4_) / iVar52 + iVar41;
                          pqVar21 = bits + (int)(iVar13 * width);
                          do {
                            if ((int)uVar29 >> 8 < iVar23 >> 8) {
                              uVar36 = ((int)((~uVar29 & 0xff) * iVar44) >> 8) + local_3070;
                              lVar56 = (long)((int)uVar29 >> 8);
                              do {
                                uVar33 = -uVar36;
                                if (0 < (int)uVar36) {
                                  uVar33 = uVar36;
                                }
                                uVar34 = pqVar21[lVar56];
                                uVar38 = -uVar34;
                                if (0 < (int)uVar34) {
                                  uVar38 = uVar34;
                                }
                                if (uVar33 < uVar38) {
                                  uVar34 = uVar36;
                                }
                                pqVar21[lVar56] = uVar34;
                                uVar36 = uVar36 + iVar44;
                                lVar56 = lVar56 + 1;
                              } while (iVar23 >> 8 != (int)lVar56);
                            }
                            uVar29 = uVar29 + local_308c;
                            iVar23 = iVar23 + local_3090;
                            pqVar21 = pqVar21 + lVar35;
                            iVar50 = iVar50 + -1;
                          } while (iVar50 != 0);
                        }
                        uVar29 = iVar12 + (iVar42 - iVar37) * local_3090 +
                                 (int)((uVar28 & 0xff) * iVar48) / iVar53;
                        if (iVar42 != iVar15) {
                          uVar58 = (long)(int)(((local_2f80->m_i | 0xffU) - (pQVar43->yp).m_i) *
                                               local_3070 * 2) /
                                   (long)(local_3028->m_i - local_2f98->m_i) & 0xffffffff;
                          iVar50 = iVar15 - iVar42;
                          pqVar21 = bits + (int)(iVar42 * width);
                          do {
                            if ((int)uVar29 >> 8 < iVar23 >> 8) {
                              uVar36 = ((int)((~uVar29 & 0xff) * iVar44) >> 8) + (int)uVar58;
                              lVar56 = (long)((int)uVar29 >> 8);
                              do {
                                uVar33 = -uVar36;
                                if (0 < (int)uVar36) {
                                  uVar33 = uVar36;
                                }
                                uVar34 = pqVar21[lVar56];
                                uVar28 = -uVar34;
                                if (0 < (int)uVar34) {
                                  uVar28 = uVar34;
                                }
                                if (uVar33 < uVar28) {
                                  uVar34 = uVar36;
                                }
                                pqVar21[lVar56] = uVar34;
                                uVar36 = uVar36 + iVar44;
                                lVar56 = lVar56 + 1;
                              } while (iVar23 >> 8 != (int)lVar56);
                            }
                            uVar29 = uVar29 + local_3090;
                            uVar58 = (ulong)(uint)((int)uVar58 + local_3084);
                            iVar23 = iVar23 + local_3090;
                            pqVar21 = pqVar21 + lVar35;
                            iVar50 = iVar50 + -1;
                          } while (iVar50 != 0);
                        }
                        iVar54 = iVar54 - iVar15;
                        if (iVar54 != 0) {
                          uVar36 = (((local_3018->xp).m_i - (local_3008->xp).m_i) * (int)local_2ff0)
                                   / (local_3028->m_i - local_2f80->m_i) + (local_2fe8->xp).m_i;
                          pqVar21 = bits + (int)(iVar15 * width);
                          do {
                            if ((int)uVar29 >> 8 < (int)uVar36 >> 8) {
                              uVar33 = ((int)((~uVar36 & 0xff) * iVar44) >> 8) -
                                       (local_3070 + iVar44);
                              lVar56 = (long)((int)uVar36 >> 8);
                              do {
                                uVar34 = -uVar33;
                                if (0 < (int)uVar33) {
                                  uVar34 = uVar33;
                                }
                                uVar28 = pqVar21[lVar56 + -1];
                                uVar38 = -uVar28;
                                if (0 < (int)uVar28) {
                                  uVar38 = uVar28;
                                }
                                if (uVar34 < uVar38) {
                                  uVar28 = uVar33;
                                }
                                pqVar21[lVar56 + -1] = uVar28;
                                lVar56 = lVar56 + -1;
                                uVar33 = uVar33 - iVar44;
                              } while ((int)uVar29 >> 8 != (int)lVar56);
                            }
                            uVar29 = uVar29 + local_3090;
                            uVar36 = uVar36 + local_308c;
                            pqVar21 = pqVar21 + lVar35;
                            iVar54 = iVar54 + -1;
                          } while (iVar54 != 0);
                        }
                      }
                    }
                    else if ((int)uVar34 < iVar23) {
                      uVar36 = ((iVar41 - iVar30) * (int)local_2ff0) / iVar52 + local_2fb4;
                      if (iVar15 != iVar13) {
                        iVar50 = iVar6 + (iVar15 - iVar14) * local_3090 +
                                 (int)(iVar48 * uVar29) / iVar53;
                        iVar23 = iVar13 - iVar15;
                        pqVar21 = bits + (int)(iVar15 * width);
                        do {
                          if (iVar50 >> 8 < (int)uVar36 >> 8) {
                            uVar29 = ((int)((~uVar36 & 0xff) * iVar44) >> 8) - (local_3070 + iVar44)
                            ;
                            lVar56 = (long)((int)uVar36 >> 8);
                            do {
                              uVar33 = -uVar29;
                              if (0 < (int)uVar29) {
                                uVar33 = uVar29;
                              }
                              uVar34 = pqVar21[lVar56 + -1];
                              uVar38 = -uVar34;
                              if (0 < (int)uVar34) {
                                uVar38 = uVar34;
                              }
                              if (uVar33 < uVar38) {
                                uVar34 = uVar29;
                              }
                              pqVar21[lVar56 + -1] = uVar34;
                              lVar56 = lVar56 + -1;
                              uVar29 = uVar29 - iVar44;
                            } while (iVar50 >> 8 != (int)lVar56);
                          }
                          iVar50 = iVar50 + local_3090;
                          uVar36 = uVar36 + local_308c;
                          pqVar21 = pqVar21 + lVar35;
                          iVar23 = iVar23 + -1;
                        } while (iVar23 != 0);
                      }
                      uVar29 = (local_2ffc._4_4_ * (iVar41 - iVar30)) / iVar52 + iVar41;
                      if (iVar13 != iVar54) {
                        pqVar21 = bits + (int)(iVar13 * width);
                        iVar23 = iVar54 - iVar13;
                        uVar33 = uVar29;
                        do {
                          if ((int)uVar33 >> 8 < (int)uVar36 >> 8) {
                            uVar34 = ((int)((~uVar36 & 0xff) * iVar44) >> 8) - (local_3070 + iVar44)
                            ;
                            lVar56 = (long)((int)uVar36 >> 8);
                            do {
                              uVar38 = -uVar34;
                              if (0 < (int)uVar34) {
                                uVar38 = uVar34;
                              }
                              uVar55 = pqVar21[lVar56 + -1];
                              uVar49 = -uVar55;
                              if (0 < (int)uVar55) {
                                uVar49 = uVar55;
                              }
                              if (uVar38 < uVar49) {
                                uVar55 = uVar34;
                              }
                              pqVar21[lVar56 + -1] = uVar55;
                              lVar56 = lVar56 + -1;
                              uVar34 = uVar34 - iVar44;
                            } while ((int)uVar33 >> 8 != (int)lVar56);
                          }
                          uVar33 = uVar33 + local_308c;
                          uVar36 = uVar36 + local_308c;
                          pqVar21 = pqVar21 + lVar35;
                          iVar23 = iVar23 + -1;
                        } while (iVar23 != 0);
                        uVar29 = uVar29 + (iVar54 - iVar13) * local_308c;
                      }
                      if (iVar54 != iVar42) {
                        iVar23 = (iVar54 - iVar37) * local_3090 + (pQVar43->xp).m_i +
                                 (int)(((local_3018->xp).m_i - (local_2fe8->xp).m_i) *
                                      (uVar28 & 0xff)) / (local_3028->m_i - local_2f98->m_i);
                        iVar42 = iVar42 - iVar54;
                        pqVar21 = bits + (int)(iVar54 * width);
                        do {
                          if ((int)uVar29 >> 8 < iVar23 >> 8) {
                            uVar36 = ((int)((~uVar29 & 0xff) * iVar44) >> 8) + local_3070;
                            lVar56 = (long)((int)uVar29 >> 8);
                            do {
                              uVar33 = -uVar36;
                              if (0 < (int)uVar36) {
                                uVar33 = uVar36;
                              }
                              uVar34 = pqVar21[lVar56];
                              uVar28 = -uVar34;
                              if (0 < (int)uVar34) {
                                uVar28 = uVar34;
                              }
                              if (uVar33 < uVar28) {
                                uVar34 = uVar36;
                              }
                              pqVar21[lVar56] = uVar34;
                              uVar36 = uVar36 + iVar44;
                              lVar56 = lVar56 + 1;
                            } while (iVar23 >> 8 != (int)lVar56);
                          }
                          uVar29 = uVar29 + local_308c;
                          iVar23 = iVar23 + local_3090;
                          pqVar21 = pqVar21 + lVar35;
                          iVar42 = iVar42 + -1;
                        } while (iVar42 != 0);
                      }
                    }
                    else {
                      iVar23 = iVar6 + (iVar15 - iVar14) * local_3090 +
                               (int)(uVar29 * iVar48) / iVar53;
                      iVar50 = iVar54 - iVar15;
                      if (iVar50 != 0) {
                        uVar29 = ((iVar41 - iVar30) * (int)local_2ff0) / iVar52 + local_2fb4;
                        pqVar21 = bits + (int)(iVar15 * width);
                        do {
                          if (iVar23 >> 8 < (int)uVar29 >> 8) {
                            uVar36 = ((int)((~uVar29 & 0xff) * iVar44) >> 8) - (local_3070 + iVar44)
                            ;
                            lVar56 = (long)((int)uVar29 >> 8);
                            do {
                              uVar33 = -uVar36;
                              if (0 < (int)uVar36) {
                                uVar33 = uVar36;
                              }
                              uVar34 = pqVar21[lVar56 + -1];
                              uVar38 = -uVar34;
                              if (0 < (int)uVar34) {
                                uVar38 = uVar34;
                              }
                              if (uVar33 < uVar38) {
                                uVar34 = uVar36;
                              }
                              pqVar21[lVar56 + -1] = uVar34;
                              lVar56 = lVar56 + -1;
                              uVar36 = uVar36 - iVar44;
                            } while (iVar23 >> 8 != (int)lVar56);
                          }
                          iVar23 = iVar23 + local_3090;
                          uVar29 = uVar29 + local_308c;
                          pqVar21 = pqVar21 + lVar35;
                          iVar50 = iVar50 + -1;
                        } while (iVar50 != 0);
                      }
                      uVar29 = iVar12 + (iVar54 - iVar37) * local_3090 +
                               (int)((uVar28 & 0xff) * iVar48) / iVar53;
                      if (iVar54 != iVar13) {
                        iVar53 = iVar13 - iVar54;
                        pqVar21 = bits + (int)(iVar54 * width);
                        iVar50 = (int)(((local_2f68->m_i | 0xffU) - (pQVar43->yp).m_i) * local_3070
                                      * 2) / (local_3028->m_i - local_2f98->m_i) - iVar44;
                        do {
                          if (iVar23 >> 8 < (int)uVar29 >> 8) {
                            lVar56 = (long)((int)uVar29 >> 8);
                            uVar36 = ((int)((~uVar29 & 0xff) * iVar44) >> 8) + iVar50;
                            do {
                              uVar33 = -uVar36;
                              if (0 < (int)uVar36) {
                                uVar33 = uVar36;
                              }
                              uVar34 = pqVar21[lVar56 + -1];
                              uVar28 = -uVar34;
                              if (0 < (int)uVar34) {
                                uVar28 = uVar34;
                              }
                              if (uVar33 < uVar28) {
                                uVar34 = uVar36;
                              }
                              pqVar21[lVar56 + -1] = uVar34;
                              lVar56 = lVar56 + -1;
                              uVar36 = uVar36 - iVar44;
                            } while (iVar23 >> 8 != (int)lVar56);
                          }
                          iVar23 = iVar23 + local_3090;
                          uVar29 = uVar29 + local_3090;
                          pqVar21 = pqVar21 + lVar35;
                          iVar50 = iVar50 + local_3084;
                          iVar53 = iVar53 + -1;
                        } while (iVar53 != 0);
                      }
                      iVar42 = iVar42 - iVar13;
                      if (iVar42 != 0) {
                        iVar23 = (local_3018->xp).m_i;
                        uVar36 = ((iVar23 - (local_3008->xp).m_i) * local_2ffc._4_4_) /
                                 (local_3028->m_i - local_2f80->m_i) + iVar23;
                        pqVar21 = bits + (int)(iVar13 * width);
                        do {
                          if ((int)uVar36 >> 8 < (int)uVar29 >> 8) {
                            uVar33 = ((int)((~uVar36 & 0xff) * iVar44) >> 8) + local_3070;
                            lVar56 = (long)((int)uVar36 >> 8);
                            do {
                              uVar34 = -uVar33;
                              if (0 < (int)uVar33) {
                                uVar34 = uVar33;
                              }
                              uVar28 = pqVar21[lVar56];
                              uVar38 = -uVar28;
                              if (0 < (int)uVar28) {
                                uVar38 = uVar28;
                              }
                              if (uVar34 < uVar38) {
                                uVar28 = uVar33;
                              }
                              pqVar21[lVar56] = uVar28;
                              uVar33 = uVar33 + iVar44;
                              lVar56 = lVar56 + 1;
                            } while ((int)uVar29 >> 8 != (int)lVar56);
                          }
                          uVar36 = uVar36 + local_308c;
                          uVar29 = uVar29 + local_3090;
                          pqVar21 = pqVar21 + lVar35;
                          iVar42 = iVar42 + -1;
                        } while (iVar42 != 0);
                      }
                    }
                  }
                  else {
                    local_3070 = 0x7f80;
                    if (iVar50 < (pQVar1->yp).m_i) {
                      local_3070 = -0x7f80;
                      local_2fc8 = &local_1c50.yp;
                      local_3018 = &local_1c50;
                      pRVar19 = &local_2f40.yp;
                      local_2fdc._4_8_ = &local_302c;
                      local_2ff0 = (QPoint *)local_2fdc;
                      unique0x00005300 = &local_3000;
                      local_3010 = (QPoint *)local_2ffc;
                      pQVar18 = pQVar43;
                      pQVar43 = pQVar1;
                    }
                    else {
                      local_2fc8 = &local_3000;
                      local_3018 = (QPoint *)local_2ffc;
                      pRVar19 = &local_302c;
                      local_2fdc._4_8_ = &local_2f40.yp;
                      local_2ff0 = &local_2f40;
                      unique0x00005300 = &local_1c50.yp;
                      local_3010 = &local_1c50;
                      pQVar18 = pQVar1;
                    }
                    iVar23 = (pQVar18->yp).m_i;
                    iVar50 = iVar23 >> 8;
                    iVar53 = (int)lVar56;
                    if (iVar53 <= iVar50) {
                      iVar50 = iVar53;
                    }
                    iVar52 = 0;
                    if (iVar50 < 1) {
                      iVar50 = iVar52;
                    }
                    local_3020 = pQVar43;
                    iVar41 = (pQVar43->yp).m_i;
                    iVar30 = iVar41 >> 8;
                    if (iVar53 <= iVar30) {
                      iVar30 = iVar53;
                    }
                    if (iVar30 < 1) {
                      iVar30 = iVar52;
                    }
                    local_3008 = (QPoint *)CONCAT44(local_3008._4_4_,iVar30);
                    iVar44 = register0x00000090->m_i;
                    iVar48 = iVar44 >> 8;
                    if (iVar53 <= iVar44 >> 8) {
                      iVar48 = iVar53;
                    }
                    if (iVar48 < 1) {
                      iVar48 = iVar52;
                    }
                    iVar12 = pRVar19->m_i >> 8;
                    if (iVar53 <= iVar12) {
                      iVar12 = iVar53;
                    }
                    if (iVar12 < 1) {
                      iVar12 = iVar52;
                    }
                    iVar6 = ((Representation *)local_2fdc._4_8_)->m_i;
                    iVar14 = iVar6 >> 8;
                    if (iVar53 <= iVar6 >> 8) {
                      iVar14 = iVar53;
                    }
                    if (iVar14 < 1) {
                      iVar14 = iVar52;
                    }
                    iVar15 = local_2fc8->m_i;
                    iVar54 = iVar15 >> 8;
                    if (iVar53 <= iVar15 >> 8) {
                      iVar54 = iVar53;
                    }
                    local_308c = 0;
                    if (iVar54 < 1) {
                      iVar54 = iVar52;
                    }
                    local_3084 = 0;
                    local_3090 = 0;
                    iVar53 = iVar6 - iVar44;
                    if (iVar53 != 0) {
                      local_3090 = (((local_2ff0->xp).m_i - (local_3010->xp).m_i) * 0x100) / iVar53;
                      local_3084 = (local_3070 << 9) / iVar53;
                    }
                    iVar52 = iVar6 - iVar15;
                    if (iVar52 != 0) {
                      local_308c = (((local_2ff0->xp).m_i - (local_3018->xp).m_i) * 0x100) / iVar52;
                    }
                    iVar13 = (local_2ff0->xp).m_i;
                    iVar42 = (local_3010->xp).m_i;
                    iVar51 = iVar13 - iVar42;
                    iVar37 = (local_3018->xp).m_i;
                    local_3028 = (Representation *)CONCAT44(local_3028._4_4_,iVar42);
                    local_2fe8 = (QPoint *)CONCAT44(local_2fe8._4_4_,iVar37);
                    iVar26 = (iVar42 - iVar37) * iVar53 + (iVar15 - iVar44) * iVar51;
                    if (iVar26 == 0) {
                      iVar26 = 0;
                    }
                    else {
                      iVar26 = (int)(((long)((iVar15 - iVar6) * local_3070) << 9) / (long)iVar26);
                    }
                    iVar32 = (iVar50 * 0x100 - iVar23) + 0xff;
                    iVar27 = (iVar30 * 0x100 - iVar41) + 0xff;
                    iVar46 = (iVar48 * 0x100 - iVar44) + 0xff;
                    iVar47 = (iVar14 * 0x100 - iVar6) + 0xff;
                    iVar23 = (pQVar43->xp).m_i;
                    iVar41 = (pQVar18->xp).m_i;
                    if (iVar23 < iVar41) {
                      if (iVar44 < iVar15) {
                        iVar23 = (iVar47 * (iVar13 - iVar37)) / iVar52 + iVar13;
                        if (iVar14 != iVar48) {
                          iVar53 = iVar41 + (iVar14 - iVar50) * local_3090 +
                                   (iVar51 * iVar32) / iVar53;
                          iVar50 = iVar48 - iVar14;
                          pqVar21 = bits + (int)(iVar14 * width);
                          do {
                            uVar29 = iVar23 >> 8;
                            if ((int)uVar29 < 1) {
                              uVar29 = 0;
                            }
                            uVar33 = iVar53 >> 8;
                            uVar36 = width;
                            if ((int)uVar33 < (int)width) {
                              uVar36 = uVar33;
                            }
                            if ((int)uVar29 < (int)uVar36) {
                              uVar58 = (ulong)uVar29;
                              uVar29 = ((int)(((uVar29 * 0x100 - iVar23) + 0xff) * iVar26) >> 8) +
                                       local_3070;
                              lVar56 = (long)(int)uVar33;
                              if (local_2fd0 < (int)uVar33) {
                                lVar56 = local_2fd0;
                              }
                              do {
                                uVar36 = -uVar29;
                                if (0 < (int)uVar29) {
                                  uVar36 = uVar29;
                                }
                                uVar33 = pqVar21[uVar58];
                                uVar34 = -uVar33;
                                if (0 < (int)uVar33) {
                                  uVar34 = uVar33;
                                }
                                if (uVar36 < uVar34) {
                                  uVar33 = uVar29;
                                }
                                pqVar21[uVar58] = uVar33;
                                uVar29 = uVar29 + iVar26;
                                uVar58 = uVar58 + 1;
                              } while ((int)lVar56 != (int)uVar58);
                            }
                            iVar23 = iVar23 + local_308c;
                            iVar53 = iVar53 + local_3090;
                            pqVar21 = pqVar21 + lVar35;
                            iVar50 = iVar50 + -1;
                          } while (iVar50 != 0);
                        }
                        iVar42 = ((iVar13 - iVar37) * iVar46) / iVar52 + iVar42;
                        if (iVar48 != iVar54) {
                          pqVar21 = bits + (int)(iVar48 * width);
                          iVar50 = iVar54 - iVar48;
                          iVar53 = iVar42;
                          do {
                            uVar29 = iVar23 >> 8;
                            if (iVar23 >> 8 < 1) {
                              uVar29 = 0;
                            }
                            uVar33 = iVar53 >> 8;
                            uVar36 = width;
                            if ((int)uVar33 < (int)width) {
                              uVar36 = uVar33;
                            }
                            if ((int)uVar29 < (int)uVar36) {
                              uVar58 = (ulong)uVar29;
                              uVar29 = ((int)(((uVar29 * 0x100 - iVar23) + 0xff) * iVar26) >> 8) +
                                       local_3070;
                              lVar56 = (long)(int)uVar33;
                              if (local_2fd0 < (int)uVar33) {
                                lVar56 = local_2fd0;
                              }
                              do {
                                uVar36 = -uVar29;
                                if (0 < (int)uVar29) {
                                  uVar36 = uVar29;
                                }
                                uVar33 = pqVar21[uVar58];
                                uVar34 = -uVar33;
                                if (0 < (int)uVar33) {
                                  uVar34 = uVar33;
                                }
                                if (uVar36 < uVar34) {
                                  uVar33 = uVar29;
                                }
                                pqVar21[uVar58] = uVar33;
                                uVar29 = uVar29 + iVar26;
                                uVar58 = uVar58 + 1;
                              } while ((int)lVar56 != (int)uVar58);
                            }
                            iVar23 = iVar23 + local_308c;
                            iVar53 = iVar53 + local_308c;
                            pqVar21 = pqVar21 + lVar35;
                            iVar50 = iVar50 + -1;
                          } while (iVar50 != 0);
                          iVar42 = iVar42 + (iVar54 - iVar48) * local_308c;
                        }
                        if (iVar54 != iVar12) {
                          iVar23 = (iVar54 - iVar30) * local_3090 + (pQVar43->xp).m_i +
                                   (((local_2ff0->xp).m_i - (local_3010->xp).m_i) * iVar27) /
                                   (((Representation *)local_2fdc._4_8_)->m_i -
                                   register0x00000090->m_i);
                          iVar12 = iVar12 - iVar54;
                          pqVar21 = local_2fa8 + (int)(iVar54 * width);
                          do {
                            iVar50 = iVar23 >> 8;
                            if (iVar50 < 1) {
                              iVar50 = 0;
                            }
                            uVar29 = iVar42 >> 8;
                            if ((int)width <= iVar42 >> 8) {
                              uVar29 = width;
                            }
                            if (iVar50 < (int)uVar29) {
                              uVar36 = ((int)(((uVar29 * 0x100 - iVar42) + 0xff) * iVar26) >> 8) -
                                       (local_3070 + iVar26);
                              puVar20 = (uint *)(pqVar21 + (int)uVar29);
                              iVar50 = iVar50 - uVar29;
                              do {
                                uVar29 = -uVar36;
                                if (0 < (int)uVar36) {
                                  uVar29 = uVar36;
                                }
                                uVar33 = *puVar20;
                                uVar34 = -uVar33;
                                if (0 < (int)uVar33) {
                                  uVar34 = uVar33;
                                }
                                if (uVar29 < uVar34) {
                                  uVar33 = uVar36;
                                }
                                *puVar20 = uVar33;
                                puVar20 = puVar20 + -1;
                                uVar36 = uVar36 - iVar26;
                                iVar50 = iVar50 + 1;
                              } while (iVar50 != 0);
                            }
                            iVar23 = iVar23 + local_3090;
                            iVar42 = iVar42 + local_308c;
                            pqVar21 = pqVar21 + lVar35;
                            iVar12 = iVar12 + -1;
                          } while (iVar12 != 0);
                        }
                      }
                      else {
                        iVar44 = (iVar27 * iVar51) / iVar53;
                        local_3028 = (Representation *)CONCAT44(local_3028._4_4_,iVar44);
                        iVar53 = iVar41 + (iVar14 - iVar50) * local_3090 +
                                 (iVar32 * iVar51) / iVar53;
                        iVar50 = iVar54 - iVar14;
                        if (iVar50 != 0) {
                          iVar13 = ((iVar13 - iVar37) * iVar47) / iVar52 + iVar13;
                          pqVar21 = bits + (int)(iVar14 * width);
                          do {
                            uVar29 = iVar13 >> 8;
                            if ((int)uVar29 < 1) {
                              uVar29 = 0;
                            }
                            uVar33 = iVar53 >> 8;
                            uVar36 = width;
                            if ((int)uVar33 < (int)width) {
                              uVar36 = uVar33;
                            }
                            if ((int)uVar29 < (int)uVar36) {
                              uVar58 = (ulong)uVar29;
                              uVar29 = ((int)(((uVar29 * 0x100 - iVar13) + 0xff) * iVar26) >> 8) +
                                       local_3070;
                              lVar56 = (long)(int)uVar33;
                              if (local_2fd0 < (int)uVar33) {
                                lVar56 = local_2fd0;
                              }
                              do {
                                uVar36 = -uVar29;
                                if (0 < (int)uVar29) {
                                  uVar36 = uVar29;
                                }
                                uVar33 = pqVar21[uVar58];
                                uVar34 = -uVar33;
                                if (0 < (int)uVar33) {
                                  uVar34 = uVar33;
                                }
                                if (uVar36 < uVar34) {
                                  uVar33 = uVar29;
                                }
                                pqVar21[uVar58] = uVar33;
                                uVar29 = uVar29 + iVar26;
                                uVar58 = uVar58 + 1;
                              } while ((int)lVar56 != (int)uVar58);
                            }
                            iVar13 = iVar13 + local_308c;
                            iVar53 = iVar53 + local_3090;
                            pqVar21 = pqVar21 + lVar35;
                            iVar50 = iVar50 + -1;
                          } while (iVar50 != 0);
                        }
                        iVar44 = iVar23 + (iVar54 - iVar30) * local_3090 + iVar44;
                        if (iVar54 != iVar48) {
                          uVar58 = (long)(int)(((iVar54 << 8 | 0xffU) - (pQVar43->yp).m_i) *
                                               local_3070 * 2) /
                                   (long)(((Representation *)local_2fdc._4_8_)->m_i -
                                         register0x00000090->m_i) & 0xffffffff;
                          iVar23 = iVar48 - iVar54;
                          pqVar21 = bits + (int)(iVar54 * width);
                          do {
                            uVar29 = iVar44 >> 8;
                            if ((int)uVar29 < 1) {
                              uVar29 = 0;
                            }
                            uVar33 = iVar53 >> 8;
                            uVar36 = width;
                            if ((int)uVar33 < (int)width) {
                              uVar36 = uVar33;
                            }
                            if ((int)uVar29 < (int)uVar36) {
                              uVar45 = (ulong)uVar29;
                              uVar29 = ((int)(((uVar29 * 0x100 - iVar44) + 0xff) * iVar26) >> 8) +
                                       (int)uVar58;
                              lVar56 = (long)(int)uVar33;
                              if (local_2fd0 < (int)uVar33) {
                                lVar56 = local_2fd0;
                              }
                              do {
                                uVar36 = -uVar29;
                                if (0 < (int)uVar29) {
                                  uVar36 = uVar29;
                                }
                                uVar33 = pqVar21[uVar45];
                                uVar34 = -uVar33;
                                if (0 < (int)uVar33) {
                                  uVar34 = uVar33;
                                }
                                if (uVar36 < uVar34) {
                                  uVar33 = uVar29;
                                }
                                pqVar21[uVar45] = uVar33;
                                uVar29 = uVar29 + iVar26;
                                uVar45 = uVar45 + 1;
                              } while ((int)lVar56 != (int)uVar45);
                            }
                            iVar44 = iVar44 + local_3090;
                            uVar58 = (ulong)(uint)((int)uVar58 + local_3084);
                            iVar53 = iVar53 + local_3090;
                            pqVar21 = pqVar21 + lVar35;
                            iVar23 = iVar23 + -1;
                          } while (iVar23 != 0);
                        }
                        iVar12 = iVar12 - iVar48;
                        if (iVar12 != 0) {
                          iVar23 = (((local_2ff0->xp).m_i - (local_3018->xp).m_i) * iVar46) /
                                   (((Representation *)local_2fdc._4_8_)->m_i - local_2fc8->m_i) +
                                   (local_3010->xp).m_i;
                          pqVar21 = local_2fa8 + (int)(iVar48 * width);
                          do {
                            iVar50 = iVar44 >> 8;
                            if (iVar50 < 1) {
                              iVar50 = 0;
                            }
                            uVar29 = iVar23 >> 8;
                            if ((int)width <= iVar23 >> 8) {
                              uVar29 = width;
                            }
                            if (iVar50 < (int)uVar29) {
                              uVar36 = ((int)(((uVar29 * 0x100 - iVar23) + 0xff) * iVar26) >> 8) -
                                       (local_3070 + iVar26);
                              puVar20 = (uint *)(pqVar21 + (int)uVar29);
                              iVar50 = iVar50 - uVar29;
                              do {
                                uVar29 = -uVar36;
                                if (0 < (int)uVar36) {
                                  uVar29 = uVar36;
                                }
                                uVar33 = *puVar20;
                                uVar34 = -uVar33;
                                if (0 < (int)uVar33) {
                                  uVar34 = uVar33;
                                }
                                if (uVar29 < uVar34) {
                                  uVar33 = uVar36;
                                }
                                *puVar20 = uVar33;
                                puVar20 = puVar20 + -1;
                                uVar36 = uVar36 - iVar26;
                                iVar50 = iVar50 + 1;
                              } while (iVar50 != 0);
                            }
                            iVar44 = iVar44 + local_3090;
                            iVar23 = iVar23 + local_308c;
                            pqVar21 = pqVar21 + lVar35;
                            iVar12 = iVar12 + -1;
                          } while (iVar12 != 0);
                        }
                      }
                    }
                    else if (iVar6 < pRVar19->m_i) {
                      iVar42 = ((iVar13 - iVar37) * iVar46) / iVar52 + iVar42;
                      if (iVar48 != iVar14) {
                        iVar50 = iVar41 + (iVar48 - iVar50) * local_3090 +
                                 (iVar51 * iVar32) / iVar53;
                        iVar23 = iVar14 - iVar48;
                        pqVar21 = local_2fa8 + (int)(iVar48 * width);
                        do {
                          iVar53 = iVar50 >> 8;
                          if (iVar50 >> 8 < 1) {
                            iVar53 = 0;
                          }
                          uVar29 = iVar42 >> 8;
                          if ((int)width <= iVar42 >> 8) {
                            uVar29 = width;
                          }
                          if (iVar53 < (int)uVar29) {
                            uVar36 = ((int)(((uVar29 * 0x100 - iVar42) + 0xff) * iVar26) >> 8) -
                                     (local_3070 + iVar26);
                            puVar20 = (uint *)(pqVar21 + (int)uVar29);
                            iVar53 = iVar53 - uVar29;
                            do {
                              uVar29 = -uVar36;
                              if (0 < (int)uVar36) {
                                uVar29 = uVar36;
                              }
                              uVar33 = *puVar20;
                              uVar34 = -uVar33;
                              if (0 < (int)uVar33) {
                                uVar34 = uVar33;
                              }
                              if (uVar29 < uVar34) {
                                uVar33 = uVar36;
                              }
                              *puVar20 = uVar33;
                              puVar20 = puVar20 + -1;
                              uVar36 = uVar36 - iVar26;
                              iVar53 = iVar53 + 1;
                            } while (iVar53 != 0);
                          }
                          iVar50 = iVar50 + local_3090;
                          iVar42 = iVar42 + local_308c;
                          pqVar21 = pqVar21 + lVar35;
                          iVar23 = iVar23 + -1;
                        } while (iVar23 != 0);
                      }
                      iVar13 = (iVar47 * (iVar13 - iVar37)) / iVar52 + iVar13;
                      if (iVar14 != iVar12) {
                        pqVar21 = local_2fa8 + (int)(iVar14 * width);
                        iVar23 = iVar12 - iVar14;
                        iVar50 = iVar13;
                        do {
                          iVar53 = iVar50 >> 8;
                          if (iVar50 >> 8 < 1) {
                            iVar53 = 0;
                          }
                          uVar29 = iVar42 >> 8;
                          if ((int)width <= iVar42 >> 8) {
                            uVar29 = width;
                          }
                          if (iVar53 < (int)uVar29) {
                            uVar36 = ((int)(((uVar29 * 0x100 - iVar42) + 0xff) * iVar26) >> 8) -
                                     (local_3070 + iVar26);
                            puVar20 = (uint *)(pqVar21 + (int)uVar29);
                            iVar53 = iVar53 - uVar29;
                            do {
                              uVar29 = -uVar36;
                              if (0 < (int)uVar36) {
                                uVar29 = uVar36;
                              }
                              uVar33 = *puVar20;
                              uVar34 = -uVar33;
                              if (0 < (int)uVar33) {
                                uVar34 = uVar33;
                              }
                              if (uVar29 < uVar34) {
                                uVar33 = uVar36;
                              }
                              *puVar20 = uVar33;
                              puVar20 = puVar20 + -1;
                              uVar36 = uVar36 - iVar26;
                              iVar53 = iVar53 + 1;
                            } while (iVar53 != 0);
                          }
                          iVar50 = iVar50 + local_308c;
                          iVar42 = iVar42 + local_308c;
                          pqVar21 = pqVar21 + lVar35;
                          iVar23 = iVar23 + -1;
                        } while (iVar23 != 0);
                        iVar13 = iVar13 + (iVar12 - iVar14) * local_308c;
                      }
                      if (iVar12 != iVar54) {
                        iVar23 = (iVar12 - iVar30) * local_3090 + (pQVar43->xp).m_i +
                                 (((local_2ff0->xp).m_i - (local_3010->xp).m_i) * iVar27) /
                                 (((Representation *)local_2fdc._4_8_)->m_i -
                                 register0x00000090->m_i);
                        iVar54 = iVar54 - iVar12;
                        pqVar21 = bits + (int)(iVar12 * width);
                        do {
                          uVar29 = iVar13 >> 8;
                          if ((int)uVar29 < 1) {
                            uVar29 = 0;
                          }
                          uVar33 = iVar23 >> 8;
                          uVar36 = width;
                          if ((int)uVar33 < (int)width) {
                            uVar36 = uVar33;
                          }
                          if ((int)uVar29 < (int)uVar36) {
                            uVar58 = (ulong)uVar29;
                            uVar29 = ((int)(((uVar29 * 0x100 - iVar13) + 0xff) * iVar26) >> 8) +
                                     local_3070;
                            lVar56 = (long)(int)uVar33;
                            if (local_2fd0 < (int)uVar33) {
                              lVar56 = local_2fd0;
                            }
                            do {
                              uVar36 = -uVar29;
                              if (0 < (int)uVar29) {
                                uVar36 = uVar29;
                              }
                              uVar33 = pqVar21[uVar58];
                              uVar34 = -uVar33;
                              if (0 < (int)uVar33) {
                                uVar34 = uVar33;
                              }
                              if (uVar36 < uVar34) {
                                uVar33 = uVar29;
                              }
                              pqVar21[uVar58] = uVar33;
                              uVar29 = uVar29 + iVar26;
                              uVar58 = uVar58 + 1;
                            } while ((int)lVar56 != (int)uVar58);
                          }
                          iVar13 = iVar13 + local_308c;
                          iVar23 = iVar23 + local_3090;
                          pqVar21 = pqVar21 + lVar35;
                          iVar54 = iVar54 + -1;
                        } while (iVar54 != 0);
                      }
                    }
                    else {
                      iVar41 = iVar41 + (iVar48 - iVar50) * local_3090 + (iVar32 * iVar51) / iVar53;
                      iVar50 = iVar12 - iVar48;
                      if (iVar50 != 0) {
                        iVar42 = ((iVar13 - iVar37) * iVar46) / iVar52 + iVar42;
                        pqVar21 = local_2fa8 + (int)(iVar48 * width);
                        do {
                          iVar52 = iVar41 >> 8;
                          if (iVar41 >> 8 < 1) {
                            iVar52 = 0;
                          }
                          uVar29 = iVar42 >> 8;
                          if ((int)width <= iVar42 >> 8) {
                            uVar29 = width;
                          }
                          if (iVar52 < (int)uVar29) {
                            uVar36 = ((int)(((uVar29 * 0x100 - iVar42) + 0xff) * iVar26) >> 8) -
                                     (local_3070 + iVar26);
                            puVar20 = (uint *)(pqVar21 + (int)uVar29);
                            iVar52 = iVar52 - uVar29;
                            do {
                              uVar29 = -uVar36;
                              if (0 < (int)uVar36) {
                                uVar29 = uVar36;
                              }
                              uVar33 = *puVar20;
                              uVar34 = -uVar33;
                              if (0 < (int)uVar33) {
                                uVar34 = uVar33;
                              }
                              if (uVar29 < uVar34) {
                                uVar33 = uVar36;
                              }
                              *puVar20 = uVar33;
                              puVar20 = puVar20 + -1;
                              uVar36 = uVar36 - iVar26;
                              iVar52 = iVar52 + 1;
                            } while (iVar52 != 0);
                          }
                          iVar41 = iVar41 + local_3090;
                          iVar42 = iVar42 + local_308c;
                          pqVar21 = pqVar21 + lVar35;
                          iVar50 = iVar50 + -1;
                        } while (iVar50 != 0);
                      }
                      iVar23 = iVar23 + (iVar12 - iVar30) * local_3090 + (iVar27 * iVar51) / iVar53;
                      if (iVar12 != iVar14) {
                        iVar53 = iVar14 - iVar12;
                        pqVar21 = local_2fa8 + (int)(iVar12 * width);
                        iVar50 = (int)(((iVar12 << 8 | 0xffU) - (pQVar43->yp).m_i) * local_3070 * 2)
                                 / (((Representation *)local_2fdc._4_8_)->m_i -
                                   register0x00000090->m_i) - iVar26;
                        do {
                          iVar52 = iVar41 >> 8;
                          if (iVar52 < 1) {
                            iVar52 = 0;
                          }
                          uVar29 = iVar23 >> 8;
                          if ((int)width <= iVar23 >> 8) {
                            uVar29 = width;
                          }
                          if (iVar52 < (int)uVar29) {
                            puVar20 = (uint *)(pqVar21 + (int)uVar29);
                            iVar52 = iVar52 - uVar29;
                            uVar29 = ((int)(((uVar29 * 0x100 - iVar23) + 0xff) * iVar26) >> 8) +
                                     iVar50;
                            do {
                              uVar36 = -uVar29;
                              if (0 < (int)uVar29) {
                                uVar36 = uVar29;
                              }
                              uVar33 = *puVar20;
                              uVar34 = -uVar33;
                              if (0 < (int)uVar33) {
                                uVar34 = uVar33;
                              }
                              if (uVar36 < uVar34) {
                                uVar33 = uVar29;
                              }
                              *puVar20 = uVar33;
                              puVar20 = puVar20 + -1;
                              uVar29 = uVar29 - iVar26;
                              iVar52 = iVar52 + 1;
                            } while (iVar52 != 0);
                          }
                          iVar41 = iVar41 + local_3090;
                          iVar23 = iVar23 + local_3090;
                          pqVar21 = pqVar21 + lVar35;
                          iVar50 = iVar50 + local_3084;
                          iVar53 = iVar53 + -1;
                        } while (iVar53 != 0);
                      }
                      iVar54 = iVar54 - iVar14;
                      if (iVar54 != 0) {
                        iVar50 = (local_2ff0->xp).m_i;
                        iVar50 = ((iVar50 - (local_3018->xp).m_i) * iVar47) /
                                 (((Representation *)local_2fdc._4_8_)->m_i - local_2fc8->m_i) +
                                 iVar50;
                        pqVar21 = bits + (int)(iVar14 * width);
                        do {
                          uVar29 = iVar50 >> 8;
                          if ((int)uVar29 < 1) {
                            uVar29 = 0;
                          }
                          uVar33 = iVar23 >> 8;
                          uVar36 = width;
                          if ((int)uVar33 < (int)width) {
                            uVar36 = uVar33;
                          }
                          if ((int)uVar29 < (int)uVar36) {
                            uVar58 = (ulong)uVar29;
                            uVar29 = ((int)(((uVar29 * 0x100 - iVar50) + 0xff) * iVar26) >> 8) +
                                     local_3070;
                            lVar56 = (long)(int)uVar33;
                            if (local_2fd0 < (int)uVar33) {
                              lVar56 = local_2fd0;
                            }
                            do {
                              uVar36 = -uVar29;
                              if (0 < (int)uVar29) {
                                uVar36 = uVar29;
                              }
                              uVar33 = pqVar21[uVar58];
                              uVar34 = -uVar33;
                              if (0 < (int)uVar33) {
                                uVar34 = uVar33;
                              }
                              if (uVar36 < uVar34) {
                                uVar33 = uVar29;
                              }
                              pqVar21[uVar58] = uVar33;
                              uVar29 = uVar29 + iVar26;
                              uVar58 = uVar58 + 1;
                            } while ((int)lVar56 != (int)uVar58);
                          }
                          iVar50 = iVar50 + local_308c;
                          iVar23 = iVar23 + local_3090;
                          pqVar21 = pqVar21 + lVar35;
                          iVar54 = iVar54 + -1;
                        } while (iVar54 != 0);
                      }
                    }
                  }
                  iVar23 = (int)local_2f88;
                  if (*(char *)((long)local_2de8.super_QVLABaseBase.ptr + (long)local_2fc0) ==
                      '\x01') {
                    if (cVar3 == '\0') {
                      while( true ) {
                        iVar23 = (int)uVar16;
                        uVar36 = (int)uVar31 * -0x1090 + iVar23 * 0x3dd2 >> 0xe;
                        uVar16 = (ulong)uVar36;
                        uVar29 = iVar23 * 0x1090 + (int)uVar31 * 0x3dd2 >> 0xe;
                        uVar31 = (ulong)uVar29;
                        piVar2 = (int *)((long)local_2cd0.super_QVLABaseBase.ptr +
                                        (long)local_2fc0 * 8);
                        if ((int)(uVar36 * *(int *)((long)local_24b8.super_QVLABaseBase.ptr +
                                                   (long)local_2fc0 * 8 + 4)) <=
                            (int)(uVar29 * *(int *)((long)local_24b8.super_QVLABaseBase.ptr +
                                                   (long)local_2fc0 * 8))) break;
                        local_2f48.yp.m_i = piVar2[1] - uVar29;
                        local_2f48.xp.m_i = *piVar2 - uVar36;
                        drawTriangle<((anonymous_namespace)::FillClip)0>
                                  (bits,width,(int)piVar2,&local_2f40,&local_2f48,(QPoint *)0x7f80,
                                   in_stack_ffffffffffffcf68);
                        local_2f40 = local_2f48;
                      }
                      local_2f48.yp.m_i =
                           piVar2[1] -
                           *(int *)((long)local_24b8.super_QVLABaseBase.ptr +
                                   (long)local_2fc0 * 8 + 4);
                      local_2f48.xp.m_i =
                           *piVar2 - *(int *)((long)local_24b8.super_QVLABaseBase.ptr +
                                             (long)local_2fc0 * 8);
                      drawTriangle<((anonymous_namespace)::FillClip)0>
                                (bits,width,(int)piVar2,&local_2f40,&local_2f48,(QPoint *)0x7f80,
                                 in_stack_ffffffffffffcf68);
                    }
                    else {
                      while( true ) {
                        iVar50 = (int)uVar16;
                        uVar36 = (int)uVar31 * -0x1090 + iVar50 * 0x3dd2 >> 0xe;
                        uVar16 = (ulong)uVar36;
                        uVar29 = iVar50 * 0x1090 + (int)uVar31 * 0x3dd2 >> 0xe;
                        uVar31 = (ulong)uVar29;
                        pQVar1 = (QPoint *)
                                 ((long)local_2cd0.super_QVLABaseBase.ptr + (long)local_2fc0 * 8);
                        iVar50 = (pQVar1->xp).m_i;
                        if ((int)(uVar36 * *(int *)((long)local_24b8.super_QVLABaseBase.ptr +
                                                   (long)local_2fc0 * 8 + 4)) <=
                            (int)(uVar29 * *(int *)((long)local_24b8.super_QVLABaseBase.ptr +
                                                   (long)local_2fc0 * 8))) break;
                        local_2f48.yp.m_i = (pQVar1->yp).m_i - uVar29;
                        local_2f48.xp.m_i = iVar50 - uVar36;
                        drawTriangle<((anonymous_namespace)::FillClip)1>
                                  (bits,width,iVar23,pQVar1,&local_2f40,&local_2f48,0x7f80);
                        local_2f40 = local_2f48;
                      }
                      local_2f48.yp.m_i =
                           (pQVar1->yp).m_i -
                           *(int *)((long)local_24b8.super_QVLABaseBase.ptr +
                                   (long)local_2fc0 * 8 + 4);
                      local_2f48.xp.m_i =
                           iVar50 - *(int *)((long)local_24b8.super_QVLABaseBase.ptr +
                                            (long)local_2fc0 * 8);
                      in_stack_ffffffffffffcf68 = 0x7f80;
                      drawTriangle<((anonymous_namespace)::FillClip)1>
                                (bits,width,iVar23,pQVar1,&local_2f40,&local_2f48,0x7f80);
                    }
                  }
                  else if (cVar3 == '\0') {
                    while( true ) {
                      iVar23 = (int)uVar16;
                      uVar36 = (int)uVar31 * 0x1090 + iVar23 * 0x3dd2 >> 0xe;
                      uVar16 = (ulong)uVar36;
                      uVar29 = iVar23 * -0x1090 + (int)uVar31 * 0x3dd2 >> 0xe;
                      uVar31 = (ulong)uVar29;
                      piVar2 = (int *)((long)local_2cd0.super_QVLABaseBase.ptr +
                                      (long)local_2fc0 * 8);
                      if ((int)(uVar29 * *(int *)((long)local_24b8.super_QVLABaseBase.ptr +
                                                 (long)local_2fc0 * 8)) <=
                          (int)(uVar36 * *(int *)((long)local_24b8.super_QVLABaseBase.ptr +
                                                 (long)local_2fc0 * 8 + 4))) break;
                      local_2f48.yp.m_i = piVar2[1] + uVar29;
                      local_2f48.xp.m_i = *piVar2 + uVar36;
                      drawTriangle<((anonymous_namespace)::FillClip)0>
                                (bits,width,(int)piVar2,&local_2f48,&local_1c50,(QPoint *)0xffff8080
                                 ,in_stack_ffffffffffffcf68);
                      local_1c50 = local_2f48;
                    }
                    local_2f48.yp.m_i =
                         *(int *)((long)local_24b8.super_QVLABaseBase.ptr + (long)local_2fc0 * 8 + 4
                                 ) + piVar2[1];
                    local_2f48.xp.m_i =
                         *piVar2 + *(int *)((long)local_24b8.super_QVLABaseBase.ptr +
                                           (long)local_2fc0 * 8);
                    drawTriangle<((anonymous_namespace)::FillClip)0>
                              (bits,width,(int)piVar2,&local_2f48,&local_1c50,(QPoint *)0xffff8080,
                               in_stack_ffffffffffffcf68);
                  }
                  else {
                    while( true ) {
                      iVar50 = (int)uVar16;
                      uVar36 = (int)uVar31 * 0x1090 + iVar50 * 0x3dd2 >> 0xe;
                      uVar16 = (ulong)uVar36;
                      uVar29 = iVar50 * -0x1090 + (int)uVar31 * 0x3dd2 >> 0xe;
                      uVar31 = (ulong)uVar29;
                      pQVar1 = (QPoint *)
                               ((long)local_2cd0.super_QVLABaseBase.ptr + (long)local_2fc0 * 8);
                      iVar50 = (pQVar1->xp).m_i;
                      if ((int)(uVar29 * *(int *)((long)local_24b8.super_QVLABaseBase.ptr +
                                                 (long)local_2fc0 * 8)) <=
                          (int)(uVar36 * *(int *)((long)local_24b8.super_QVLABaseBase.ptr +
                                                 (long)local_2fc0 * 8 + 4))) break;
                      local_2f48.yp.m_i = (pQVar1->yp).m_i + uVar29;
                      local_2f48.xp.m_i = iVar50 + uVar36;
                      drawTriangle<((anonymous_namespace)::FillClip)1>
                                (bits,width,iVar23,pQVar1,&local_2f48,&local_1c50,-0x7f80);
                      local_1c50 = local_2f48;
                    }
                    local_2f48.yp.m_i =
                         *(int *)((long)local_24b8.super_QVLABaseBase.ptr + (long)local_2fc0 * 8 + 4
                                 ) + (pQVar1->yp).m_i;
                    local_2f48.xp.m_i =
                         iVar50 + *(int *)((long)local_24b8.super_QVLABaseBase.ptr +
                                          (long)local_2fc0 * 8);
                    in_stack_ffffffffffffcf68 = -0x7f80;
                    drawTriangle<((anonymous_namespace)::FillClip)1>
                              (bits,width,iVar23,pQVar1,&local_2f48,&local_1c50,-0x7f80);
                  }
                  iVar50 = (int)local_2f58;
                  lVar57 = local_2f58 + 1;
                  lVar56 = lVar25;
                } while (lVar57 < local_24b8.super_QVLABaseBase.s);
              }
            }
            iVar23 = -local_2f74;
          } while (iVar23 < local_2f18.siz);
        }
        if (0 < (int)lVar25) {
          puVar22 = local_2fb0->data;
          iVar23 = 0;
          pqVar21 = bits;
          do {
            uVar16 = (ulong)width;
            if (0 < (int)width) {
              do {
                *puVar22 = (uchar)((uint)(0x7f80 - *pqVar21) >> 8);
                pqVar21 = pqVar21 + 1;
                puVar22 = puVar22 + 1;
                uVar29 = (int)uVar16 - 1;
                uVar16 = (ulong)uVar29;
              } while (uVar29 != 0);
            }
            iVar23 = iVar23 + 1;
          } while (iVar23 != (int)lVar25);
        }
        if ((undefined1 *)local_2f00.super_QVLABaseBase.ptr != local_2ee8) {
          QtPrivate::sizedFree(local_2f00.super_QVLABaseBase.ptr,local_2f00.super_QVLABaseBase.a);
        }
        if ((undefined1 *)local_2de8.super_QVLABaseBase.ptr != local_2dd0) {
          QtPrivate::sizedFree(local_2de8.super_QVLABaseBase.ptr,local_2de8.super_QVLABaseBase.a);
        }
        if ((undefined1 *)local_2cd0.super_QVLABaseBase.ptr != local_2cb8) {
          QtPrivate::sizedFree
                    (local_2cd0.super_QVLABaseBase.ptr,local_2cd0.super_QVLABaseBase.a << 3);
        }
        if ((undefined1 *)local_24b8.super_QVLABaseBase.ptr != local_24a0) {
          QtPrivate::sizedFree
                    (local_24b8.super_QVLABaseBase.ptr,local_24b8.super_QVLABaseBase.a << 3);
        }
        operator_delete__(bits);
      }
      if (local_2f38.buffer != (QPoint *)0x0) {
        QtPrivate::sizedFree(local_2f38.buffer,local_2f38.capacity << 3);
      }
      if (local_2f18.buffer != (uint *)0x0) {
        QtPrivate::sizedFree(local_2f18.buffer,local_2f18.capacity << 2);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_2fb0;
}

Assistant:

QDistanceFieldData *QDistanceFieldData::create(QSize size, const QPainterPath &path, bool doubleResolution)
{
    QDistanceFieldData *data = create(size);
    makeDistanceField(data,
                      path,
                      QT_DISTANCEFIELD_SCALE(doubleResolution),
                      QT_DISTANCEFIELD_RADIUS(doubleResolution) / QT_DISTANCEFIELD_SCALE(doubleResolution));
    return data;
}